

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

CollSeq * sqlite3FindCollSeq(sqlite3 *db,u8 enc,char *zName,int create)

{
  CollSeq *local_30;
  CollSeq *pColl;
  int create_local;
  char *zName_local;
  u8 enc_local;
  sqlite3 *db_local;
  
  if (zName == (char *)0x0) {
    local_30 = db->pDfltColl;
  }
  else {
    local_30 = findCollSeqEntry(db,zName,create);
  }
  if (local_30 != (CollSeq *)0x0) {
    local_30 = local_30 + (int)(enc - 1);
  }
  return local_30;
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3FindCollSeq(
  sqlite3 *db,
  u8 enc,
  const char *zName,
  int create
){
  CollSeq *pColl;
  if( zName ){
    pColl = findCollSeqEntry(db, zName, create);
  }else{
    pColl = db->pDfltColl;
  }
  assert( SQLITE_UTF8==1 && SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
  assert( enc>=SQLITE_UTF8 && enc<=SQLITE_UTF16BE );
  if( pColl ) pColl += enc-1;
  return pColl;
}